

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int getnum(char **fmt,int df)

{
  char *pcVar1;
  int iVar2;
  bool local_21;
  int local_20;
  int a;
  int df_local;
  char **fmt_local;
  
  iVar2 = digit((int)**fmt);
  fmt_local._4_4_ = df;
  if (iVar2 != 0) {
    local_20 = 0;
    do {
      pcVar1 = *fmt;
      *fmt = pcVar1 + 1;
      local_20 = local_20 * 10 + *pcVar1 + -0x30;
      iVar2 = digit((int)**fmt);
      local_21 = iVar2 != 0 && local_20 < 0xccccccc;
      fmt_local._4_4_ = local_20;
    } while (local_21);
  }
  return fmt_local._4_4_;
}

Assistant:

static int getnum (const char **fmt, int df) {
  if (!digit(**fmt))  /* no number? */
    return df;  /* return default value */
  else {
    int a = 0;
    do {
      a = a*10 + (*((*fmt)++) - '0');
    } while (digit(**fmt) && a <= ((int)MAXSIZE - 9)/10);
    return a;
  }
}